

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_rectpack.h
# Opt level: O0

int rect_height_compare(void *a,void *b)

{
  undefined4 local_34;
  stbrp_rect *q;
  stbrp_rect *p;
  void *b_local;
  void *a_local;
  
  if (*(int *)((long)b + 8) < *(int *)((long)a + 8)) {
    a_local._4_4_ = 0xffffffff;
  }
  else if (*(int *)((long)a + 8) < *(int *)((long)b + 8)) {
    a_local._4_4_ = 1;
  }
  else {
    if (*(int *)((long)b + 4) < *(int *)((long)a + 4)) {
      local_34 = 0xffffffff;
    }
    else {
      local_34 = (uint)(*(int *)((long)a + 4) < *(int *)((long)b + 4));
    }
    a_local._4_4_ = local_34;
  }
  return a_local._4_4_;
}

Assistant:

static int STBRP__CDECL rect_height_compare(const void *a, const void *b)
{
   const stbrp_rect *p = (const stbrp_rect *) a;
   const stbrp_rect *q = (const stbrp_rect *) b;
   if (p->h > q->h)
      return -1;
   if (p->h < q->h)
      return  1;
   return (p->w > q->w) ? -1 : (p->w < q->w);
}